

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O0

string * __thiscall
beast::SemanticVersion::print_abi_cxx11_(string *__return_storage_ptr__,SemanticVersion *this)

{
  bool bVar1;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  SemanticVersion *local_18;
  SemanticVersion *this_local;
  string *s;
  
  local_19 = 0;
  local_18 = this;
  this_local = (SemanticVersion *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_c0,this->majorVersion);
  std::operator+(&local_a0,&local_c0,".");
  std::__cxx11::to_string(&local_f0,this->minorVersion);
  std::operator+(&local_80,&local_a0,&local_f0);
  std::operator+(&local_60,&local_80,".");
  std::__cxx11::to_string(&local_110,this->patchVersion);
  std::operator+(&local_40,&local_60,&local_110);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = unit_test::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&this->preReleaseIdentifiers);
  if (!bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-");
    print_identifiers(&local_130,&this->preReleaseIdentifiers);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
  }
  bVar1 = unit_test::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&this->metaData);
  if (!bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"+");
    print_identifiers(&local_150,&this->metaData);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SemanticVersion::print () const
{
    std::string s;

    s = std::to_string (majorVersion) + "." +
        std::to_string (minorVersion) + "." +
        std::to_string (patchVersion);

    if (!preReleaseIdentifiers.empty ())
    {
        s += "-";
        s += print_identifiers (preReleaseIdentifiers);
    }

    if (!metaData.empty ())
    {
        s += "+";
        s += print_identifiers (metaData);
    }

    return s;
}